

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HostAddress_p.cpp
# Opt level: O0

bool __thiscall BamTools::Internal::HostAddress::operator<(HostAddress *this,HostAddress *other)

{
  int iVar1;
  int *in_RSI;
  int *in_RDI;
  
  if (*in_RDI == 0) {
    if (*in_RSI == 0) {
      return (uint)in_RDI[1] < (uint)in_RSI[1];
    }
  }
  else if ((*in_RDI == 1) && (*in_RSI == 1)) {
    iVar1 = memcmp(in_RDI + 2,in_RSI + 2,0x10);
    return iVar1 < 0;
  }
  return *in_RDI < *in_RSI;
}

Assistant:

bool HostAddress::operator<(const HostAddress& other) const
{

    // if self is IPv4
    if (m_protocol == HostAddress::IPv4Protocol) {
        if (other.m_protocol == HostAddress::IPv4Protocol) {
            return m_ip4Address < other.m_ip4Address;
        }
    }

    // if self is IPv6
    else if (m_protocol == HostAddress::IPv6Protocol) {
        if (other.m_protocol == HostAddress::IPv6Protocol) {
            return (std::memcmp(&m_ip6Address, &other.m_ip6Address, sizeof(IPv6Address)) < 0);
        }
    }

    // otherwise compare protocol types
    return m_protocol < other.m_protocol;
}